

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O0

int wally_wif_from_bytes
              (uchar *priv_key,size_t priv_key_len,uint32_t prefix,uint32_t flags,char **output)

{
  size_t local_60;
  size_t buf_len;
  uchar buf [34];
  int ret;
  char **output_local;
  uint32_t flags_local;
  uint32_t prefix_local;
  size_t priv_key_len_local;
  uchar *priv_key_local;
  
  local_60 = 0x22;
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if ((((priv_key == (uchar *)0x0) || (priv_key_len != 0x20)) || ((prefix & 0xffffff00) != 0)) ||
     (((flags & 0xfffffffe) != 0 || (output == (char **)0x0)))) {
    priv_key_local._4_4_ = -2;
  }
  else {
    buf_len._0_1_ = (undefined1)prefix;
    unique0x00012000 = *(undefined8 *)priv_key;
    buf._1_8_ = *(undefined8 *)(priv_key + 8);
    buf._9_8_ = *(undefined8 *)(priv_key + 0x10);
    buf._17_8_ = *(undefined8 *)(priv_key + 0x18);
    if ((flags & 1) == 0) {
      buf[0x19] = '\x01';
    }
    else {
      local_60 = 0x21;
    }
    unique0x10000078 = output;
    buf._28_4_ = wally_base58_from_bytes((uchar *)&buf_len,local_60,1,output);
    wally_clear(&buf_len,0x22);
    priv_key_local._4_1_ = buf[0x1c];
    priv_key_local._5_1_ = buf[0x1d];
    priv_key_local._6_1_ = buf[0x1e];
    priv_key_local._7_1_ = buf[0x1f];
  }
  return priv_key_local._4_4_;
}

Assistant:

int wally_wif_from_bytes(const unsigned char *priv_key,
                         size_t priv_key_len,
                         uint32_t prefix,
                         uint32_t flags,
                         char **output)
{
    int ret;
    unsigned char buf[2 + EC_PRIVATE_KEY_LEN];
    size_t buf_len = sizeof(buf);

    if (output)
        *output = NULL;

    if(!priv_key || priv_key_len != EC_PRIVATE_KEY_LEN || (prefix & ~0xff) ||
       (flags & ~WIF_ALL_DEFINED_FLAGS) || !output)
        return WALLY_EINVAL;

    buf[0] = (unsigned char) prefix & 0xff;
    memcpy(&buf[1], priv_key, EC_PRIVATE_KEY_LEN);

    if (flags & WALLY_WIF_FLAG_UNCOMPRESSED)
        buf_len--;
    else
        buf[buf_len - 1] = 0x01;

    ret = wally_base58_from_bytes(buf, buf_len, BASE58_FLAG_CHECKSUM, output);

    wally_clear(buf, sizeof(buf));
    return ret;
}